

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O0

void __thiscall Vector<int>::Vector(Vector<int> *this,int N)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  int local_18;
  int i;
  int N_local;
  Vector<int> *this_local;
  
  this->N = N;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)N;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->values = piVar3;
  for (local_18 = 0; local_18 < N; local_18 = local_18 + 1) {
    this->values[local_18] = 0;
  }
  return;
}

Assistant:

Vector(int N) : N(N), values(new T[N])
    {
        for(auto i=0; i<N; ++i)
            values[i] = 0;
    }